

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O0

char * zt_os_progpath(void)

{
  ssize_t sVar1;
  char *result;
  size_t in_stack_00000fe8;
  char *in_stack_00000ff0;
  char *local_8;
  
  local_8 = (char *)calloc(1,0x1001);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = _proc_get_path(in_stack_00000ff0,in_stack_00000fe8);
    if (sVar1 == -1) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"Could not get program path");
    }
  }
  return local_8;
}

Assistant:

char *
zt_os_progpath() {
    char    * result = NULL;

    if ((result = calloc(sizeof(char), PATH_MAX+1)) == NULL) {
        return NULL;
    }

    /*
     * OSX: _NSGetExecutablePath()
     * Solaris: getexecname() or readlink /proc/<pid>/path/a.out
     * Linux: readlink /proc/<pid>/exe
     * FreeBSD:  sysctl CTL_KERN KERN_PROC KERN_PROC_PATHNAME -1
     * BSD w/ Procfs: readlink /proc/curproc/file
     * Windows:  GetModuleFileName() with hModule = NULL
     */
#if defined(__APPLE__)
    {
        uint32_t     size = PATH_MAX;
        _NSGetExecutablePath(result, &size);
    }
#elif defined(WIN32)
	{
		DWORD size = PATH_MAX;
		GetModuleFileName(NULL, result, size);
	}
#else
    if (_proc_get_path(result, PATH_MAX) == -1) {
        zt_log_printf(zt_log_err, "Could not get program path");
    }
#endif
    return result;
}